

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int exprNodeIsConstantOrGroupBy(Walker *pWalker,Expr *pExpr)

{
  ExprList *pEVar1;
  Expr *pB;
  Parse *pParse;
  uint uVar2;
  int iVar3;
  CollSeq *pCVar4;
  ExprList_item *pEVar5;
  long lVar6;
  
  pEVar1 = (pWalker->u).pGroupBy;
  if (0 < pEVar1->nExpr) {
    pEVar5 = pEVar1->a;
    lVar6 = 0;
    do {
      pB = pEVar5->pExpr;
      uVar2 = sqlite3ExprCompare((Parse *)0x0,pExpr,pB,-1);
      if (uVar2 < 2) {
        pParse = pWalker->pParse;
        pCVar4 = sqlite3ExprCollSeq(pParse,pB);
        if (((pCVar4 == (CollSeq *)0x0) &&
            (pCVar4 = pParse->db->pDfltColl, pCVar4 == (CollSeq *)0x0)) ||
           ((pCVar4->xCmp == binCollFunc && (pCVar4->pUser == (void *)0x0)))) {
          return 1;
        }
      }
      lVar6 = lVar6 + 1;
      pEVar5 = pEVar5 + 1;
    } while (lVar6 < pEVar1->nExpr);
  }
  if ((pExpr->flags & 0x800) != 0) {
    pWalker->eCode = '\0';
    return 2;
  }
  iVar3 = exprNodeIsConstant(pWalker,pExpr);
  return iVar3;
}

Assistant:

static int exprNodeIsConstantOrGroupBy(Walker *pWalker, Expr *pExpr){
  ExprList *pGroupBy = pWalker->u.pGroupBy;
  int i;

  /* Check if pExpr is identical to any GROUP BY term. If so, consider
  ** it constant.  */
  for(i=0; i<pGroupBy->nExpr; i++){
    Expr *p = pGroupBy->a[i].pExpr;
    if( sqlite3ExprCompare(0, pExpr, p, -1)<2 ){
      CollSeq *pColl = sqlite3ExprNNCollSeq(pWalker->pParse, p);
      if( sqlite3IsBinary(pColl) ){
        return WRC_Prune;
      }
    }
  }

  /* Check if pExpr is a sub-select. If so, consider it variable. */
  if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  return exprNodeIsConstant(pWalker, pExpr);
}